

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offsets.cpp
# Opt level: O1

bool __thiscall loader::offsets::load_offsets_at(offsets *this,istream *is,uint32_t pos)

{
  ostringstream *poVar1;
  uint uVar2;
  _func_int *p_Var3;
  int iVar4;
  log_level lVar5;
  long *plVar6;
  long lVar7;
  uint uVar8;
  crc32 checksum;
  char magic [12];
  char buffer [4];
  print_hex<char_*> local_1c8;
  long local_1bc;
  int local_1b4;
  logger local_1b0;
  
  plVar6 = (long *)std::istream::seekg(is,pos,0);
  iVar4 = (int)is;
  if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
    plVar6 = (long *)std::istream::read((char *)is,(long)&local_1bc);
    if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
      lVar7 = 0;
      do {
        if (*(int *)((long)&DAT_00158828 + lVar7) == local_1b4 &&
            *(long *)((long)&(anonymous_namespace)::known_setup_loader_versions + lVar7) ==
            local_1bc) {
          uVar8 = *(uint *)(&UNK_0015882c + lVar7);
          goto LAB_00134521;
        }
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x70);
      uVar8 = 0;
LAB_00134521:
      if (uVar8 == 0) {
        poVar1 = &local_1b0.buffer;
        local_1b0.level = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Unexpected setup loader magic: ",0x1f);
        local_1c8.value = (char *)&local_1bc;
        detail::operator<<((ostream *)poVar1,&local_1c8);
        logger::~logger(&local_1b0);
        uVar8 = 0xffffffff;
      }
      local_1c8.value._0_4_ = 0xffffffff;
      crypto::crc32::update((crc32 *)&local_1c8,(char *)&local_1bc,0xc);
      if (0x50104ff < uVar8) {
        std::istream::read((char *)is,(long)&local_1b0);
        crypto::crc32::update((crc32 *)&local_1c8,(char *)&local_1b0,4);
        uVar2 = *(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]);
        if ((uVar2 & 5) == 0) {
          if (local_1b0.level != Info) {
            poVar1 = &local_1b0.buffer;
            local_1b0.level = Warning;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Unexpected setup loader revision: ",0x22);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            logger::~logger(&local_1b0);
          }
        }
        else {
          std::ios::clear((int)is->_vptr_basic_istream[-3] + iVar4);
        }
        if ((uVar2 & 5) != 0) {
          return false;
        }
      }
      std::istream::read((char *)is,(long)&local_1b0);
      crypto::crc32::update((crc32 *)&local_1c8,(char *)&local_1b0,4);
      std::istream::read((char *)is,(long)&local_1b0);
      crypto::crc32::update((crc32 *)&local_1c8,(char *)&local_1b0,4);
      this->exe_offset = local_1b0.level;
      lVar5 = Debug;
      if (uVar8 < 0x4010600) {
        std::istream::read((char *)is,(long)&local_1b0);
        crypto::crc32::update((crc32 *)&local_1c8,(char *)&local_1b0,4);
        lVar5 = local_1b0.level;
      }
      this->exe_compressed_size = lVar5;
      std::istream::read((char *)is,(long)&local_1b0);
      crypto::crc32::update((crc32 *)&local_1c8,(char *)&local_1b0,4);
      this->exe_uncompressed_size = local_1b0.level;
      if (uVar8 < 0x4000300) {
        (this->exe_checksum).type = Adler32;
      }
      else {
        (this->exe_checksum).type = CRC32;
      }
      std::istream::read((char *)is,(long)&local_1b0);
      crypto::crc32::update((crc32 *)&local_1c8,(char *)&local_1b0,4);
      (this->exe_checksum).field_0.adler32 = local_1b0.level;
      lVar5 = Debug;
      if (uVar8 < 0x4000000) {
        std::istream::read((char *)is,(long)&local_1b0);
        lVar5 = local_1b0.level;
      }
      this->message_offset = lVar5;
      std::istream::read((char *)is,(long)&local_1b0);
      crypto::crc32::update((crc32 *)&local_1c8,(char *)&local_1b0,4);
      this->header_offset = local_1b0.level;
      std::istream::read((char *)is,(long)&local_1b0);
      crypto::crc32::update((crc32 *)&local_1c8,(char *)&local_1b0,4);
      this->data_offset = local_1b0.level;
      p_Var3 = is->_vptr_basic_istream[-3];
      if (((&is->field_0x20)[(long)p_Var3] & 5) == 0) {
        if (0x40009ff < uVar8) {
          std::istream::read((char *)is,(long)&local_1b0);
          uVar8 = *(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]);
          if ((uVar8 & 5) == 0) {
            if ((local_1b0.level ^ (log_level)local_1c8.value) != ~Debug) {
              local_1b0.level = Warning;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.buffer);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1b0.buffer,"Setup loader checksum mismatch!",0x1f);
              logger::~logger(&local_1b0);
            }
          }
          else {
            std::ios::clear(iVar4 + (int)is->_vptr_basic_istream[-3]);
          }
          if ((uVar8 & 5) != 0) {
            return false;
          }
        }
        return true;
      }
      goto LAB_001344c9;
    }
  }
  p_Var3 = is->_vptr_basic_istream[-3];
LAB_001344c9:
  std::ios::clear(iVar4 + (int)p_Var3);
  return false;
}

Assistant:

bool offsets::load_offsets_at(std::istream & is, boost::uint32_t pos) {
	
	if(is.seekg(pos).fail()) {
		is.clear();
		debug("could not seek to loader header");
		return false;
	}
	
	char magic[12];
	if(is.read(magic, std::streamsize(sizeof(magic))).fail()) {
		is.clear();
		debug("could not read loader header magic");
		return false;
	}
	
	setup::version_constant version = 0;
	for(size_t i = 0; i < size_t(boost::size(known_setup_loader_versions)); i++) {
		BOOST_STATIC_ASSERT(sizeof(known_setup_loader_versions[i].magic) == sizeof(magic));
		if(!memcmp(magic, known_setup_loader_versions[i].magic, sizeof(magic))) {
			version = known_setup_loader_versions[i].version;
			debug("found loader header magic version " << setup::version(version));
			break;
		}
	}
	if(!version) {
		log_warning << "Unexpected setup loader magic: " << print_hex(magic);
		version = std::numeric_limits<setup::version_constant>::max();
	}
	
	crypto::crc32 checksum;
	checksum.init();
	checksum.update(magic, sizeof(magic));
	
	if(version >= INNO_VERSION(5, 1,  5)) {
		boost::uint32_t revision = checksum.load<boost::uint32_t>(is);
		if(is.fail()) {
			is.clear();
			debug("could not read loader header revision");
			return false;
		} else if(revision != 1) {
			log_warning << "Unexpected setup loader revision: " << revision;
		}
	}
	
	(void)checksum.load<boost::uint32_t>(is);
	exe_offset = checksum.load<boost::uint32_t>(is);
	
	if(version >= INNO_VERSION(4, 1, 6)) {
		exe_compressed_size = 0;
	} else {
		exe_compressed_size = checksum.load<boost::uint32_t>(is);
	}
	
	exe_uncompressed_size = checksum.load<boost::uint32_t>(is);
	
	if(version >= INNO_VERSION(4, 0, 3)) {
		exe_checksum.type = crypto::CRC32;
		exe_checksum.crc32 = checksum.load<boost::uint32_t>(is);
	} else {
		exe_checksum.type = crypto::Adler32;
		exe_checksum.adler32 = checksum.load<boost::uint32_t>(is);
	}
	
	if(version >= INNO_VERSION(4, 0, 0)) {
		message_offset = 0;
	} else {
		message_offset = util::load<boost::uint32_t>(is);
	}
	
	header_offset = checksum.load<boost::uint32_t>(is);
	data_offset = checksum.load<boost::uint32_t>(is);
	
	if(is.fail()) {
		is.clear();
		debug("could not read loader header");
		return false;
	}
	
	if(version >= INNO_VERSION(4, 0, 10)) {
		boost::uint32_t expected = util::load<boost::uint32_t>(is);
		if(is.fail()) {
			is.clear();
			debug("could not read loader header checksum");
			return false;
		}
		if(checksum.finalize() != expected) {
			log_warning << "Setup loader checksum mismatch!";
		}
	}
	
	return true;
}